

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O3

bool ImGui_ImplOpenGL3_CreateDeviceObjects(void)

{
  GLuint GVar1;
  GLchar *ptr;
  uint uVar2;
  char *pcVar3;
  size_t size;
  GLint log_length;
  GLint last_vertex_array;
  GLint last_array_buffer;
  GLint last_texture;
  int glsl_version;
  GLint status;
  GLchar *fragment_shader_with_version [2];
  GLchar *vertex_shader_with_version [2];
  GLint local_88;
  GLuint local_84;
  GLuint local_80;
  GLuint local_7c;
  undefined8 local_78;
  GLchar *pGStack_70;
  uint local_60;
  GLint local_5c;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  
  (*gl3wGetIntegerv)(0x8069,(GLint *)&local_7c);
  (*gl3wGetIntegerv)(0x8894,(GLint *)&local_80);
  (*gl3wGetIntegerv)(0x85b5,(GLint *)&local_84);
  local_60 = 0x82;
  __isoc99_sscanf(g_GlslVersionString,"#version %d",&local_60);
  if ((int)local_60 < 0x82) {
    pcVar3 = 
    "#ifdef GL_ES\n    precision mediump float;\n#endif\nuniform sampler2D Texture;\nvarying vec2 Frag_UV;\nvarying vec4 Frag_Color;\nvoid main()\n{\n    gl_FragColor = Frag_Color * texture2D(Texture, Frag_UV.st);\n}\n"
    ;
    local_40 = 
    "uniform mat4 ProjMtx;\nattribute vec2 Position;\nattribute vec2 UV;\nattribute vec4 Color;\nvarying vec2 Frag_UV;\nvarying vec4 Frag_Color;\nvoid main()\n{\n    Frag_UV = UV;\n    Frag_Color = Color;\n    gl_Position = ProjMtx * vec4(Position.xy,0,1);\n}\n"
    ;
  }
  else if (local_60 < 0x19a) {
    local_40 = 
    "uniform mat4 ProjMtx;\nin vec2 Position;\nin vec2 UV;\nin vec4 Color;\nout vec2 Frag_UV;\nout vec4 Frag_Color;\nvoid main()\n{\n    Frag_UV = UV;\n    Frag_Color = Color;\n    gl_Position = ProjMtx * vec4(Position.xy,0,1);\n}\n"
    ;
    if (local_60 == 300) {
      local_40 = 
      "precision mediump float;\nlayout (location = 0) in vec2 Position;\nlayout (location = 1) in vec2 UV;\nlayout (location = 2) in vec4 Color;\nuniform mat4 ProjMtx;\nout vec2 Frag_UV;\nout vec4 Frag_Color;\nvoid main()\n{\n    Frag_UV = UV;\n    Frag_Color = Color;\n    gl_Position = ProjMtx * vec4(Position.xy,0,1);\n}\n"
      ;
    }
    pcVar3 = 
    "uniform sampler2D Texture;\nin vec2 Frag_UV;\nin vec4 Frag_Color;\nout vec4 Out_Color;\nvoid main()\n{\n    Out_Color = Frag_Color * texture(Texture, Frag_UV.st);\n}\n"
    ;
    if (local_60 == 300) {
      pcVar3 = 
      "precision mediump float;\nuniform sampler2D Texture;\nin vec2 Frag_UV;\nin vec4 Frag_Color;\nlayout (location = 0) out vec4 Out_Color;\nvoid main()\n{\n    Out_Color = Frag_Color * texture(Texture, Frag_UV.st);\n}\n"
      ;
    }
  }
  else {
    pcVar3 = 
    "in vec2 Frag_UV;\nin vec4 Frag_Color;\nuniform sampler2D Texture;\nlayout (location = 0) out vec4 Out_Color;\nvoid main()\n{\n    Out_Color = Frag_Color * texture(Texture, Frag_UV.st);\n}\n"
    ;
    local_40 = 
    "layout (location = 0) in vec2 Position;\nlayout (location = 1) in vec2 UV;\nlayout (location = 2) in vec4 Color;\nuniform mat4 ProjMtx;\nout vec2 Frag_UV;\nout vec4 Frag_Color;\nvoid main()\n{\n    Frag_UV = UV;\n    Frag_Color = Color;\n    gl_Position = ProjMtx * vec4(Position.xy,0,1);\n}\n"
    ;
  }
  local_48 = g_GlslVersionString;
  g_VertHandle = (*gl3wCreateShader)(0x8b31);
  (*gl3wShaderSource)(g_VertHandle,2,&local_48,(GLint *)0x0);
  (*gl3wCompileShader)(g_VertHandle);
  CheckShader(g_VertHandle,"vertex shader");
  local_58 = g_GlslVersionString;
  local_50 = pcVar3;
  g_FragHandle = (*gl3wCreateShader)(0x8b30);
  (*gl3wShaderSource)(g_FragHandle,2,&local_58,(GLint *)0x0);
  (*gl3wCompileShader)(g_FragHandle);
  CheckShader(g_FragHandle,"fragment shader");
  g_ShaderHandle = (*gl3wCreateProgram)();
  (*gl3wAttachShader)(g_ShaderHandle,g_VertHandle);
  (*gl3wAttachShader)(g_ShaderHandle,g_FragHandle);
  (*gl3wLinkProgram)(g_ShaderHandle);
  GVar1 = g_ShaderHandle;
  local_5c = 0;
  local_88 = 0;
  (*gl3wGetProgramiv)(g_ShaderHandle,0x8b82,&local_5c);
  (*gl3wGetProgramiv)(GVar1,0x8b84,&local_88);
  if ((char)local_5c == '\0') {
    ImGui_ImplOpenGL3_CreateDeviceObjects();
  }
  if (1 < local_88) {
    local_78 = 0;
    pGStack_70 = (GLchar *)0x0;
    uVar2 = local_88 + 1;
    size = 8;
    if (8 < uVar2) {
      size = (size_t)uVar2;
    }
    ptr = (GLchar *)ImGui::MemAlloc(size);
    local_78 = CONCAT44((int)size,uVar2);
    pGStack_70 = ptr;
    (*gl3wGetProgramInfoLog)(GVar1,local_88,(GLsizei *)0x0,ptr);
    fprintf(_stderr,"%s\n",ptr);
    if (ptr != (GLchar *)0x0) {
      ImGui::MemFree(ptr);
    }
  }
  g_AttribLocationTex = (*gl3wGetUniformLocation)(g_ShaderHandle,"Texture");
  g_AttribLocationProjMtx = (*gl3wGetUniformLocation)(g_ShaderHandle,"ProjMtx");
  g_AttribLocationVtxPos = (*gl3wGetAttribLocation)(g_ShaderHandle,"Position");
  g_AttribLocationVtxUV = (*gl3wGetAttribLocation)(g_ShaderHandle,"UV");
  g_AttribLocationVtxColor = (*gl3wGetAttribLocation)(g_ShaderHandle,"Color");
  (*gl3wGenBuffers)(1,&g_VboHandle);
  (*gl3wGenBuffers)(1,&g_ElementsHandle);
  ImGui_ImplOpenGL3_CreateFontsTexture();
  (*gl3wBindTexture)(0xde1,local_7c);
  (*gl3wBindBuffer)(0x8892,local_80);
  (*gl3wBindVertexArray)(local_84);
  return true;
}

Assistant:

bool    ImGui_ImplOpenGL3_CreateDeviceObjects()
{
    // Backup GL state
    GLint last_texture, last_array_buffer;
    glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
    glGetIntegerv(GL_ARRAY_BUFFER_BINDING, &last_array_buffer);
#ifndef IMGUI_IMPL_OPENGL_ES2
    GLint last_vertex_array;
    glGetIntegerv(GL_VERTEX_ARRAY_BINDING, &last_vertex_array);
#endif

    // Parse GLSL version string
    int glsl_version = 130;
    sscanf(g_GlslVersionString, "#version %d", &glsl_version);

    const GLchar* vertex_shader_glsl_120 =
        "uniform mat4 ProjMtx;\n"
        "attribute vec2 Position;\n"
        "attribute vec2 UV;\n"
        "attribute vec4 Color;\n"
        "varying vec2 Frag_UV;\n"
        "varying vec4 Frag_Color;\n"
        "void main()\n"
        "{\n"
        "    Frag_UV = UV;\n"
        "    Frag_Color = Color;\n"
        "    gl_Position = ProjMtx * vec4(Position.xy,0,1);\n"
        "}\n";

    const GLchar* vertex_shader_glsl_130 =
        "uniform mat4 ProjMtx;\n"
        "in vec2 Position;\n"
        "in vec2 UV;\n"
        "in vec4 Color;\n"
        "out vec2 Frag_UV;\n"
        "out vec4 Frag_Color;\n"
        "void main()\n"
        "{\n"
        "    Frag_UV = UV;\n"
        "    Frag_Color = Color;\n"
        "    gl_Position = ProjMtx * vec4(Position.xy,0,1);\n"
        "}\n";

    const GLchar* vertex_shader_glsl_300_es =
        "precision mediump float;\n"
        "layout (location = 0) in vec2 Position;\n"
        "layout (location = 1) in vec2 UV;\n"
        "layout (location = 2) in vec4 Color;\n"
        "uniform mat4 ProjMtx;\n"
        "out vec2 Frag_UV;\n"
        "out vec4 Frag_Color;\n"
        "void main()\n"
        "{\n"
        "    Frag_UV = UV;\n"
        "    Frag_Color = Color;\n"
        "    gl_Position = ProjMtx * vec4(Position.xy,0,1);\n"
        "}\n";

    const GLchar* vertex_shader_glsl_410_core =
        "layout (location = 0) in vec2 Position;\n"
        "layout (location = 1) in vec2 UV;\n"
        "layout (location = 2) in vec4 Color;\n"
        "uniform mat4 ProjMtx;\n"
        "out vec2 Frag_UV;\n"
        "out vec4 Frag_Color;\n"
        "void main()\n"
        "{\n"
        "    Frag_UV = UV;\n"
        "    Frag_Color = Color;\n"
        "    gl_Position = ProjMtx * vec4(Position.xy,0,1);\n"
        "}\n";

    const GLchar* fragment_shader_glsl_120 =
        "#ifdef GL_ES\n"
        "    precision mediump float;\n"
        "#endif\n"
        "uniform sampler2D Texture;\n"
        "varying vec2 Frag_UV;\n"
        "varying vec4 Frag_Color;\n"
        "void main()\n"
        "{\n"
        "    gl_FragColor = Frag_Color * texture2D(Texture, Frag_UV.st);\n"
        "}\n";

    const GLchar* fragment_shader_glsl_130 =
        "uniform sampler2D Texture;\n"
        "in vec2 Frag_UV;\n"
        "in vec4 Frag_Color;\n"
        "out vec4 Out_Color;\n"
        "void main()\n"
        "{\n"
        "    Out_Color = Frag_Color * texture(Texture, Frag_UV.st);\n"
        "}\n";

    const GLchar* fragment_shader_glsl_300_es =
        "precision mediump float;\n"
        "uniform sampler2D Texture;\n"
        "in vec2 Frag_UV;\n"
        "in vec4 Frag_Color;\n"
        "layout (location = 0) out vec4 Out_Color;\n"
        "void main()\n"
        "{\n"
        "    Out_Color = Frag_Color * texture(Texture, Frag_UV.st);\n"
        "}\n";

    const GLchar* fragment_shader_glsl_410_core =
        "in vec2 Frag_UV;\n"
        "in vec4 Frag_Color;\n"
        "uniform sampler2D Texture;\n"
        "layout (location = 0) out vec4 Out_Color;\n"
        "void main()\n"
        "{\n"
        "    Out_Color = Frag_Color * texture(Texture, Frag_UV.st);\n"
        "}\n";

    // Select shaders matching our GLSL versions
    const GLchar* vertex_shader = NULL;
    const GLchar* fragment_shader = NULL;
    if (glsl_version < 130)
    {
        vertex_shader = vertex_shader_glsl_120;
        fragment_shader = fragment_shader_glsl_120;
    }
    else if (glsl_version >= 410)
    {
        vertex_shader = vertex_shader_glsl_410_core;
        fragment_shader = fragment_shader_glsl_410_core;
    }
    else if (glsl_version == 300)
    {
        vertex_shader = vertex_shader_glsl_300_es;
        fragment_shader = fragment_shader_glsl_300_es;
    }
    else
    {
        vertex_shader = vertex_shader_glsl_130;
        fragment_shader = fragment_shader_glsl_130;
    }

    // Create shaders
    const GLchar* vertex_shader_with_version[2] = { g_GlslVersionString, vertex_shader };
    g_VertHandle = glCreateShader(GL_VERTEX_SHADER);
    glShaderSource(g_VertHandle, 2, vertex_shader_with_version, NULL);
    glCompileShader(g_VertHandle);
    CheckShader(g_VertHandle, "vertex shader");

    const GLchar* fragment_shader_with_version[2] = { g_GlslVersionString, fragment_shader };
    g_FragHandle = glCreateShader(GL_FRAGMENT_SHADER);
    glShaderSource(g_FragHandle, 2, fragment_shader_with_version, NULL);
    glCompileShader(g_FragHandle);
    CheckShader(g_FragHandle, "fragment shader");

    g_ShaderHandle = glCreateProgram();
    glAttachShader(g_ShaderHandle, g_VertHandle);
    glAttachShader(g_ShaderHandle, g_FragHandle);
    glLinkProgram(g_ShaderHandle);
    CheckProgram(g_ShaderHandle, "shader program");

    g_AttribLocationTex = glGetUniformLocation(g_ShaderHandle, "Texture");
    g_AttribLocationProjMtx = glGetUniformLocation(g_ShaderHandle, "ProjMtx");
    g_AttribLocationVtxPos = glGetAttribLocation(g_ShaderHandle, "Position");
    g_AttribLocationVtxUV = glGetAttribLocation(g_ShaderHandle, "UV");
    g_AttribLocationVtxColor = glGetAttribLocation(g_ShaderHandle, "Color");

    // Create buffers
    glGenBuffers(1, &g_VboHandle);
    glGenBuffers(1, &g_ElementsHandle);

    ImGui_ImplOpenGL3_CreateFontsTexture();

    // Restore modified GL state
    glBindTexture(GL_TEXTURE_2D, last_texture);
    glBindBuffer(GL_ARRAY_BUFFER, last_array_buffer);
#ifndef IMGUI_IMPL_OPENGL_ES2
    glBindVertexArray(last_vertex_array);
#endif

    return true;
}